

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataParser.cpp
# Opt level: O2

void __thiscall firmata::FirmataParser::processSysexMessage(FirmataParser *this)

{
  size_t sVar1;
  versionCallbackFunction UNRECOVERED_JUMPTABLE;
  uint8_t *puVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  void *pvVar5;
  
  puVar2 = this->dataBuffer;
  uVar4 = *puVar2;
  if (uVar4 == 'q') {
    if (this->currentStringCallback != (stringCallbackFunction)0x0) {
      sVar1 = decodeByteStream(this,this->sysexBytesRead - 1,puVar2 + 1);
      bufferDataAtPosition(this,'\0',sVar1 + 1);
      (*this->currentStringCallback)
                (this->currentStringCallbackContext,(char *)(this->dataBuffer + 1));
      return;
    }
  }
  else if (uVar4 == 'y') {
    UNRECOVERED_JUMPTABLE = this->currentReportFirmwareCallback;
    if (UNRECOVERED_JUMPTABLE != (versionCallbackFunction)0x0) {
      if (this->sysexBytesRead < 3) {
        pvVar5 = this->currentReportFirmwareCallbackContext;
        uVar4 = '\0';
        uVar3 = '\0';
        puVar2 = (uint8_t *)0x0;
      }
      else {
        sVar1 = decodeByteStream(this,this->sysexBytesRead - 3,puVar2 + 3);
        bufferDataAtPosition(this,'\0',sVar1 + 3);
        UNRECOVERED_JUMPTABLE = this->currentReportFirmwareCallback;
        puVar2 = this->dataBuffer;
        pvVar5 = this->currentReportFirmwareCallbackContext;
        uVar4 = puVar2[1];
        uVar3 = puVar2[2];
        puVar2 = puVar2 + 3;
      }
      (*UNRECOVERED_JUMPTABLE)(pvVar5,(size_t)uVar4,(size_t)uVar3,(char *)puVar2);
      return;
    }
  }
  else if (this->currentSysexCallback != (sysexCallbackFunction)0x0) {
    (*this->currentSysexCallback)
              (this->currentSysexCallbackContext,uVar4,this->sysexBytesRead - 1,puVar2 + 1);
    return;
  }
  return;
}

Assistant:

void FirmataParser::processSysexMessage(void)
{
  switch (dataBuffer[0]) { //first byte in buffer is command
    case REPORT_FIRMWARE:
      if (currentReportFirmwareCallback) {
        const size_t major_version_offset = 1;
        const size_t minor_version_offset = 2;
        const size_t string_offset = 3;
        // Test for malformed REPORT_FIRMWARE message (used to query firmware prior to Firmata v3.0.0)
        if ( 3 > sysexBytesRead ) {
          (*currentReportFirmwareCallback)(currentReportFirmwareCallbackContext, 0, 0, (const char *)NULL);
        } else {
          const size_t end_of_string = (string_offset + decodeByteStream((sysexBytesRead - string_offset), &dataBuffer[string_offset]));
          bufferDataAtPosition('\0', end_of_string); // NULL terminate the string
          (*currentReportFirmwareCallback)(currentReportFirmwareCallbackContext, (size_t)dataBuffer[major_version_offset], (size_t)dataBuffer[minor_version_offset], (const char *)&dataBuffer[string_offset]);
        }
      }
      break;
    case STRING_DATA:
      if (currentStringCallback) {
        const size_t string_offset = 1;
        const size_t end_of_string = (string_offset + decodeByteStream((sysexBytesRead - string_offset), &dataBuffer[string_offset]));
        bufferDataAtPosition('\0', end_of_string); // NULL terminate the string
        (*currentStringCallback)(currentStringCallbackContext, (const char *)&dataBuffer[string_offset]);
      }
      break;
    default:
      if (currentSysexCallback)
        (*currentSysexCallback)(currentSysexCallbackContext, dataBuffer[0], sysexBytesRead - 1, dataBuffer + 1);
  }
}